

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmMulCrand(word *c,word *a,word *b,qr_o *r,void *stack)

{
  long in_RCX;
  void *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *in_R8;
  word *unaff_retaddr;
  word *prod;
  
  zzMul((word *)stack,prod,(size_t)unaff_retaddr,in_RDI,in_RSI,in_RDX);
  zzRedCrand(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  wwCopy(in_RDI,in_R8,*(size_t *)(in_RCX + 0x30));
  return;
}

Assistant:

static void zmMulCrand(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	stack = prod + 2 * r->n;
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRedCrand(prod, r->mod, r->n, stack);
	wwCopy(c, prod, r->n);
}